

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_operators.cpp
# Opt level: O2

Matrix<long_double> *
neural_networks::utilities::matrix_operators::create(NeuralMatrix *other,Mode mod)

{
  size_t sVar1;
  Matrix<long_double> *this;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  
  this = (Matrix<long_double> *)operator_new(0x30);
  Matrix<long_double>::Matrix
            (this,(other->super_Matrix<neural_networks::utilities::Neuron_*>).N,
             (other->super_Matrix<neural_networks::utilities::Neuron_*>).M);
  sVar1 = (other->super_Matrix<neural_networks::utilities::Neuron_*>).N;
  sVar2 = 0;
  if (mod == data) {
    for (; sVar2 != sVar1; sVar2 = sVar2 + 1) {
      sVar3 = (other->super_Matrix<neural_networks::utilities::Neuron_*>).M;
      lVar4 = 0;
      while (bVar5 = sVar3 != 0, sVar3 = sVar3 - 1, bVar5) {
        *(unkbyte10 *)
         (*(long *)&(this->matrix).
                    super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar2].
                    super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data + lVar4 * 2) =
             *(unkbyte10 *)
              (*(long *)(*(long *)&(other->super_Matrix<neural_networks::utilities::Neuron_*>).
                                   matrix.
                                   super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[sVar2].
                                   super__Vector_base<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                                   ._M_impl.super__Vector_impl_data + lVar4) + 0x10);
        lVar4 = lVar4 + 8;
      }
    }
  }
  else if (mod == function) {
    for (; sVar2 != sVar1; sVar2 = sVar2 + 1) {
      sVar3 = (other->super_Matrix<neural_networks::utilities::Neuron_*>).M;
      lVar4 = 0;
      while (bVar5 = sVar3 != 0, sVar3 = sVar3 - 1, bVar5) {
        *(unkbyte10 *)
         (*(long *)&(this->matrix).
                    super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar2].
                    super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data + lVar4 * 2) =
             *(unkbyte10 *)
              (*(long *)(*(long *)&(other->super_Matrix<neural_networks::utilities::Neuron_*>).
                                   matrix.
                                   super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[sVar2].
                                   super__Vector_base<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                                   ._M_impl.super__Vector_impl_data + lVar4) + 0x20);
        lVar4 = lVar4 + 8;
      }
    }
  }
  else {
    for (; sVar2 != sVar1; sVar2 = sVar2 + 1) {
      sVar3 = (other->super_Matrix<neural_networks::utilities::Neuron_*>).M;
      lVar4 = 0;
      while (bVar5 = sVar3 != 0, sVar3 = sVar3 - 1, bVar5) {
        *(unkbyte10 *)
         (*(long *)&(this->matrix).
                    super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar2].
                    super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data + lVar4 * 2) =
             *(unkbyte10 *)
              (*(long *)(*(long *)&(other->super_Matrix<neural_networks::utilities::Neuron_*>).
                                   matrix.
                                   super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[sVar2].
                                   super__Vector_base<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                                   ._M_impl.super__Vector_impl_data + lVar4) + 0x30);
        lVar4 = lVar4 + 8;
      }
    }
  }
  return this;
}

Assistant:

Matrix<long double>* matrix_operators::create(const NeuralMatrix *other, const matrix_operators::Mode mod) {
    Matrix<long double> *new_matrix = new Matrix<long double>(other -> N, other -> M);
    if (new_matrix == nullptr) {
        std::cerr << "Error: Failed to copy NeuralMatrix object at [" << other << "]; not enough space\n";
        return nullptr;
    }
    register size_t i, j;
    switch(mod) {
        case matrix_operators::data: { // data
            for (i = 0; i < other->N; ++i) {
                for (j = 0; j < other->M; ++j) {
                    new_matrix -> matrix[i][j] = other -> matrix[i][j] -> data;
                }
            }
            return new_matrix;
        };
        case matrix_operators::function: {
            for (i = 0; i < other->N; ++i) {
                for (j = 0; j < other->M; ++j) {
                    new_matrix -> matrix[i][j] = other -> matrix[i][j] -> function;
                }
            }
            return new_matrix;
        };
        case matrix_operators::derivative: {
            for (i = 0; i < other->N; ++i) {
                for (j = 0; j < other->M; ++j) {
                    new_matrix -> matrix[i][j] = other -> matrix[i][j] -> function_derivative;
                }
            }
            return new_matrix;
        };
    }
}